

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-common.c
# Opt level: O2

int msr_is_constraint_supported
              (raplcap_msr_ctx *ctx,raplcap_zone zone,raplcap_constraint constraint)

{
  uint uVar1;
  byte bVar2;
  
  if (ctx == (raplcap_msr_ctx *)0x0) {
    __assert_fail("ctx != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                  ,0x1e6,
                  "int msr_is_constraint_supported(const raplcap_msr_ctx *, raplcap_zone, raplcap_constraint)"
                 );
  }
  if (constraint == RAPLCAP_CONSTRAINT_LONG_TERM) {
    uVar1 = 1;
  }
  else {
    bVar2 = 1;
    if (constraint != RAPLCAP_CONSTRAINT_SHORT_TERM) {
      if (constraint != RAPLCAP_CONSTRAINT_PEAK_POWER) {
        fprintf(_stderr,"%s [%s] ","[ERROR]","raplcap-msr");
        fprintf(_stderr,"Unknown constraint: %d\n",(ulong)constraint);
        fprintf(_stderr,"%s [%s] ","[ERROR]","raplcap-msr");
        fwrite("Please report a bug if you see this message, it should never occur!\n",0x44,1,
               _stderr);
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                      ,0x1f6,
                      "int msr_is_constraint_supported(const raplcap_msr_ctx *, raplcap_zone, raplcap_constraint)"
                     );
      }
      bVar2 = 2;
    }
    uVar1 = (uint)(bVar2 < ctx->cfg[zone].constraints);
  }
  return uVar1;
}

Assistant:

int msr_is_constraint_supported(const raplcap_msr_ctx* ctx, raplcap_zone zone, raplcap_constraint constraint) {
  assert(ctx != NULL);
  int ret;
  switch (constraint) {
    case RAPLCAP_CONSTRAINT_LONG_TERM:
      ret = 1;
      break;
    case RAPLCAP_CONSTRAINT_SHORT_TERM:
      ret = HAS_SHORT_TERM(ctx, zone);
      break;
    case RAPLCAP_CONSTRAINT_PEAK_POWER:
      ret = HAS_MAX_POWER(ctx, zone);
      break;
    default:
      ret = -1;
      raplcap_log(ERROR, "Unknown constraint: %d\n", constraint);
      raplcap_log(ERROR, "Please report a bug if you see this message, it should never occur!\n");
      assert(0);
      break;
  }
  raplcap_log(DEBUG, "msr_is_constraint_supported: zone=%d, constraint=%d, supported=%d\n", zone, constraint, ret);
  return ret;
}